

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall RefTable::Finalize(RefTable *this)

{
  RefNode *this_00;
  SQUnsignedInteger n;
  ulong uVar1;
  
  this_00 = this->_nodes;
  for (uVar1 = 0; uVar1 < this->_numofslots; uVar1 = uVar1 + 1) {
    SQObjectPtr::Null(&this_00->obj);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void RefTable::Finalize()
{
    RefNode *nodes = _nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        nodes->obj.Null();
        nodes++;
    }
}